

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_file_exception(sexp ctx,sexp self,char *ms,sexp ir)

{
  sexp psVar1;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp in_stack_00000038;
  char *in_stack_00000040;
  sexp in_stack_00000048;
  sexp in_stack_00000050;
  sexp *local_38;
  undefined8 local_30;
  sexp local_28 [4];
  long local_8;
  
  local_28[0] = (sexp)0x43e;
  local_8 = in_RDI;
  memset(&local_38,0,0x10);
  local_38 = local_28;
  local_30 = *(undefined8 *)(local_8 + 0x6080);
  *(sexp ***)(local_8 + 0x6080) = &local_38;
  local_28[0] = sexp_user_exception(in_stack_00000050,in_stack_00000048,in_stack_00000040,
                                    in_stack_00000038);
  psVar1 = sexp_intern(in_stack_00000048,in_stack_00000040,(sexp_sint_t)in_stack_00000038);
  (local_28[0]->value).type.name = psVar1;
  *(undefined8 *)(local_8 + 0x6080) = local_30;
  return local_28[0];
}

Assistant:

sexp sexp_file_exception (sexp ctx, sexp self, const char *ms, sexp ir) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_user_exception(ctx, self, ms, ir);
  sexp_exception_kind(res) = sexp_intern(ctx, "file", -1);
  sexp_gc_release1(ctx);
  return res;
}